

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::reportError(Parser *this,shared_ptr<Token> *token,string *errorMessage)

{
  ostream *out;
  element_type *peVar1;
  string local_60;
  shared_ptr<const_Readable> local_40;
  
  out = this->out;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"syntactic analysis","");
  peVar1 = (((this->tokenBuffer).super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->tokenizer).super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40.super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->reader).super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40.super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
       ((long)&(peVar1->reader).super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2> + 8))->
       _M_pi;
  if (local_40.super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_40.super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_40.super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Error::reportErrorAtToken(out,&local_60,&local_40,token,errorMessage);
  if (local_40.super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Parser::reportError(
    const std::shared_ptr<Token>& token,
    const std::string & errorMessage) noexcept {

  Error::reportErrorAtToken(
    this->out,
    "syntactic analysis",
    this->tokenBuffer->tokenizer->reader,
    token, errorMessage);
}